

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuCreate.c
# Opt level: O3

void Fxu_CreateCovers(Fxu_Matrix *p,Fxu_Data_t *pData)

{
  int iVar1;
  Fxu_Lit *pFVar2;
  uint uVar3;
  Fxu_Cube *pCubeNext;
  Fxu_Cube *pFVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  Fxu_Var **ppFVar9;
  ulong uVar10;
  long *plVar11;
  Fxu_Cube *pFVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  
  iVar13 = pData->nNodesOld;
  iVar5 = pData->nNodesNew;
  uVar3 = iVar5 + iVar13;
  if (uVar3 != 0 && SCARRY4(iVar5,iVar13) == (int)uVar3 < 0) {
    uVar10 = (ulong)uVar3;
    ppFVar9 = p->ppVars + 1;
    do {
      pCubeNext = (*ppFVar9)->pFirst;
      if (pCubeNext != (Fxu_Cube *)0x0) goto LAB_004b9628;
      ppFVar9 = ppFVar9 + 2;
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
  }
  pCubeNext = (Fxu_Cube *)0x0;
LAB_004b9628:
  if (0 < iVar13) {
    lVar14 = -1;
    lVar16 = 0x18;
    pFVar4 = pCubeNext;
    lVar6 = 0;
    do {
      lVar7 = lVar6 + 1;
      pCubeNext = pFVar4;
      if (pData->vSops->pArray[lVar6] != (void *)0x0) {
        if (lVar7 < (long)pData->nNodesNew + (long)iVar13) {
          lVar8 = iVar13 + lVar14 + (long)pData->nNodesNew;
          plVar11 = (long *)((long)p->ppVars + lVar16);
          do {
            pCubeNext = *(Fxu_Cube **)(*plVar11 + 8);
            if (pCubeNext != (Fxu_Cube *)0x0) goto LAB_004b9689;
            plVar11 = plVar11 + 2;
            lVar8 = lVar8 + -1;
          } while (lVar8 != 0);
        }
        pCubeNext = (Fxu_Cube *)0x0;
LAB_004b9689:
        if (pFVar4 != pCubeNext) {
          pFVar12 = pFVar4;
          do {
            pFVar2 = (pFVar12->lLits).pTail;
            if ((pFVar2 != (Fxu_Lit *)0x0) &&
               (iVar5 = pFVar2->iVar, SBORROW4(iVar5,iVar13 * 2) == iVar5 + iVar13 * -2 < 0)) {
              Fxu_CreateCoversNode(p,pData,(int)lVar6,pFVar4,pCubeNext);
              iVar13 = pData->nNodesOld;
              break;
            }
            pFVar12 = pFVar12->pNext;
          } while (pFVar12 != pCubeNext);
        }
      }
      lVar14 = lVar14 + -1;
      lVar16 = lVar16 + 0x10;
      pFVar4 = pCubeNext;
      lVar6 = lVar7;
    } while (lVar7 < iVar13);
    iVar5 = pData->nNodesNew;
  }
  if (0 < iVar5) {
    iVar13 = 0;
    iVar15 = 1;
    do {
      iVar1 = pData->nNodesOld;
      if (iVar1 + iVar13 + 1 < iVar1 + iVar5) {
        lVar6 = ((long)iVar5 + (long)iVar1) - (long)(iVar1 + iVar15);
        ppFVar9 = p->ppVars + (long)(iVar1 + iVar15) * 2 + 1;
        do {
          pFVar4 = (*ppFVar9)->pFirst;
          if (pFVar4 != (Fxu_Cube *)0x0) goto LAB_004b972c;
          ppFVar9 = ppFVar9 + 2;
          lVar6 = lVar6 + -1;
        } while (lVar6 != 0);
      }
      pFVar4 = (Fxu_Cube *)0x0;
LAB_004b972c:
      Fxu_CreateCoversNode(p,pData,iVar1 + iVar13,pCubeNext,pFVar4);
      iVar13 = iVar13 + 1;
      iVar5 = pData->nNodesNew;
      iVar15 = iVar15 + 1;
      pCubeNext = pFVar4;
    } while (iVar13 < iVar5);
  }
  return;
}

Assistant:

void Fxu_CreateCovers( Fxu_Matrix * p, Fxu_Data_t * pData )
{
    Fxu_Cube * pCube, * pCubeFirst, * pCubeNext;
    char * pSopCover;
    int iNode, n;

    // get the first cube of the first internal node 
    pCubeFirst = Fxu_CreateCoversFirstCube( p, pData, 0 );

    // go through the internal nodes
    for ( n = 0; n < pData->nNodesOld; n++ )
    if ( (pSopCover = (char *)pData->vSops->pArray[n]) )
    {
        // get the number of this node
        iNode = n;
        // get the next first cube
        pCubeNext = Fxu_CreateCoversFirstCube(  p, pData, iNode + 1 );
        // check if there any new variables in these cubes
        for ( pCube = pCubeFirst; pCube != pCubeNext; pCube = pCube->pNext )
            if ( pCube->lLits.pTail && pCube->lLits.pTail->iVar >= 2 * pData->nNodesOld )
                break;
        if ( pCube != pCubeNext )
            Fxu_CreateCoversNode( p, pData, iNode, pCubeFirst, pCubeNext );
        // update the first cube
        pCubeFirst = pCubeNext;
    }

    // add the covers for the extracted nodes
    for ( n = 0; n < pData->nNodesNew; n++ )
    {
        // get the number of this node
        iNode = pData->nNodesOld + n;
        // get the next first cube
        pCubeNext = Fxu_CreateCoversFirstCube( p, pData, iNode + 1 );
        // the node should be added
        Fxu_CreateCoversNode( p, pData, iNode, pCubeFirst, pCubeNext );
        // update the first cube
        pCubeFirst = pCubeNext;
    }
}